

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O3

Vec_Ptr_t * Abc_NtkSupport(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  uint uVar2;
  long *plVar3;
  long lVar4;
  int *__s;
  Vec_Ptr_t *vNodes;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar8;
  undefined8 extraout_RDX_05;
  int iVar9;
  long lVar10;
  
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar7 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar7 + 500;
    iVar9 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar9) {
      __s = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar9;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar7) {
      memset(__s,0,(uVar1 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar9;
  }
  iVar7 = pNtk->nTravIds;
  pNtk->nTravIds = iVar7 + 1;
  if (iVar7 < 0x3fffffff) {
    vNodes = (Vec_Ptr_t *)malloc(0x10);
    vNodes->nCap = 100;
    vNodes->nSize = 0;
    ppvVar5 = (void **)malloc(800);
    vNodes->pArray = ppvVar5;
    pVVar6 = pNtk->vCos;
    uVar8 = extraout_RDX;
    if (0 < pVVar6->nSize) {
      lVar10 = 0;
      do {
        Abc_NtkNodeSupport_rec
                  (*(Abc_Obj_t **)
                    (*(long *)(*(long *)(*pVVar6->pArray[lVar10] + 0x20) + 8) +
                    (long)**(int **)((long)pVVar6->pArray[lVar10] + 0x20) * 8),vNodes);
        lVar10 = lVar10 + 1;
        pVVar6 = pNtk->vCos;
        uVar8 = extraout_RDX_00;
      } while (lVar10 < pVVar6->nSize);
    }
    pVVar6 = pNtk->vCis;
    iVar7 = pVVar6->nSize;
    if (0 < iVar7) {
      lVar10 = 0;
      do {
        plVar3 = (long *)pVVar6->pArray[lVar10];
        lVar4 = *plVar3;
        iVar7 = (int)plVar3[2];
        Vec_IntFillExtra((Vec_Int_t *)(lVar4 + 0xe0),iVar7 + 1,(int)uVar8);
        if (((long)iVar7 < 0) || (*(int *)(lVar4 + 0xe4) <= iVar7)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar8 = extraout_RDX_01;
        if (*(int *)(*(long *)(lVar4 + 0xe8) + (long)iVar7 * 4) != *(int *)(*plVar3 + 0xd8)) {
          uVar2 = vNodes->nSize;
          if (uVar2 == vNodes->nCap) {
            if ((int)uVar2 < 0x10) {
              if (vNodes->pArray == (void **)0x0) {
                ppvVar5 = (void **)malloc(0x80);
                uVar8 = extraout_RDX_04;
              }
              else {
                ppvVar5 = (void **)realloc(vNodes->pArray,0x80);
                uVar8 = extraout_RDX_02;
              }
              vNodes->pArray = ppvVar5;
              vNodes->nCap = 0x10;
            }
            else {
              if (vNodes->pArray == (void **)0x0) {
                ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
                uVar8 = extraout_RDX_05;
              }
              else {
                ppvVar5 = (void **)realloc(vNodes->pArray,(ulong)uVar2 << 4);
                uVar8 = extraout_RDX_03;
              }
              vNodes->pArray = ppvVar5;
              vNodes->nCap = uVar2 * 2;
            }
          }
          else {
            ppvVar5 = vNodes->pArray;
          }
          vNodes->nSize = uVar2 + 1;
          ppvVar5[(int)uVar2] = plVar3;
        }
        lVar10 = lVar10 + 1;
        pVVar6 = pNtk->vCis;
        iVar7 = pVVar6->nSize;
      } while (lVar10 < iVar7);
    }
    if (vNodes->nSize == iVar7) {
      return vNodes;
    }
    __assert_fail("Vec_PtrSize(vNodes) == Abc_NtkCiNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                  ,0x36b,"Vec_Ptr_t *Abc_NtkSupport(Abc_Ntk_t *)");
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

Vec_Ptr_t * Abc_NtkSupport( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode;
    int i;
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 100 );
    // go through the PO nodes and call for each of them
    Abc_NtkForEachCo( pNtk, pNode, i )
        Abc_NtkNodeSupport_rec( Abc_ObjFanin0(pNode), vNodes );
    // add unused CIs
    Abc_NtkForEachCi( pNtk, pNode, i )
        if ( !Abc_NodeIsTravIdCurrent( pNode ) )
            Vec_PtrPush( vNodes, pNode );
    assert( Vec_PtrSize(vNodes) == Abc_NtkCiNum(pNtk) );
    return vNodes;
}